

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O3

int lrandomkey(lua_State *L)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  long lVar5;
  char tmp [8];
  byte local_20 [8];
  
  lVar5 = 0;
  bVar1 = 0;
  do {
    bVar4 = bVar1;
    lVar3 = random();
    bVar2 = (byte)lVar3;
    local_20[lVar5] = bVar2;
    lVar5 = lVar5 + 1;
    bVar1 = bVar4 ^ bVar2;
  } while (lVar5 != 8);
  if (bVar4 == bVar2) {
    local_20[0] = local_20[0] | 1;
  }
  lua_pushlstring(L,(char *)local_20,8);
  return 1;
}

Assistant:

static int
lrandomkey(lua_State *L) {
	char tmp[8];
	int i;
	char x = 0;
	for (i=0;i<8;i++) {
		tmp[i] = random() & 0xff;
		x ^= tmp[i];
	}
	if (x==0) {
		tmp[0] |= 1;	// avoid 0
	}
	lua_pushlstring(L, tmp, 8);
	return 1;
}